

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,char *fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  allocator local_ac;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"CMAKE_DISABLE_SOURCE_CHANGES","");
  pcVar4 = GetDefinition(this,&local_a8);
  bVar2 = cmSystemTools::IsOn(pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = true;
  if (bVar2) {
    pcVar4 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)&local_a8,pcVar4,(allocator *)&local_48);
    pcVar4 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
    std::__cxx11::string::string((string *)&local_88,pcVar4,(allocator *)&local_68);
    bVar2 = cmsys::SystemTools::SameFile(&local_a8,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"CMAKE_DISABLE_IN_SOURCE_BUILD","");
      pcVar4 = GetDefinition(this,&local_a8);
      bVar3 = cmSystemTools::IsOn(pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = !bVar3;
    }
    else {
      std::__cxx11::string::string((string *)&local_a8,fileName,&local_a9);
      pcVar4 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
      std::__cxx11::string::string((string *)&local_88,pcVar4,&local_aa);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&local_a8,&local_88);
      bVar3 = true;
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_48,fileName,&local_ab);
        pcVar4 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
        std::__cxx11::string::string((string *)&local_68,pcVar4,&local_ac);
        bVar3 = cmsys::SystemTools::IsSubDirectory(&local_48,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return bVar3;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(const char* fileName) const
{
  if ( !this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES") )
    {
    return true;
    }
  // If we are doing an in-source build, then the test will always fail
  if ( cmSystemTools::SameFile(this->GetHomeDirectory(),
                               this->GetHomeOutputDirectory()) )
    {
    if ( this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD") )
      {
      return false;
      }
    return true;
    }

  // Check if this is a subdirectory of the source tree but not a
  // subdirectory of the build tree
  if ( cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeDirectory()) &&
    !cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeOutputDirectory()) )
    {
    return false;
    }
  return true;
}